

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O1

void __thiscall
MathML::AST::ConstantExpression::arithmeticalBinaryOperation
          (ConstantExpression *this,ConstantExpression *result,ConstantExpression *rhs,Operator op)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double val2;
  double val1;
  long *local_80;
  long local_78;
  long local_70 [2];
  undefined **local_60;
  undefined4 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = (*(this->super_INode)._vptr_INode[9])();
  if ((iVar1 == 0) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 == 0)) {
    if (this->mErrorHandler != (ErrorHandler *)0x0) {
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"uninitilized operand(s)","");
      local_60 = &PTR__Error_009e2c80;
      local_58 = 0;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_80,local_78 + (long)local_80);
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_60);
      local_60 = &PTR__Error_009e2c80;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    (*(result->super_INode)._vptr_INode[6])(0,result);
    return;
  }
  iVar1 = (*(this->super_INode)._vptr_INode[9])(this);
  if ((((iVar1 != 1) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 != 2)) &&
      ((iVar1 = (*(this->super_INode)._vptr_INode[9])(this), iVar1 != 2 ||
       (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 != 1)))) &&
     ((iVar1 = (*(this->super_INode)._vptr_INode[9])(this), iVar1 != 2 ||
      (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 != 2)))) {
    (*(this->super_INode)._vptr_INode[10])(this);
    (*(rhs->super_INode)._vptr_INode[10])(rhs);
    arithmeticalBinaryOperation<double>(this,result,(double *)&local_60,(double *)&local_80,op);
    return;
  }
  iVar1 = (*(this->super_INode)._vptr_INode[0xb])(this);
  local_60 = (undefined **)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(rhs->super_INode)._vptr_INode[0xb])(rhs);
  local_80 = (long *)CONCAT44(extraout_var_00,iVar1);
  arithmeticalBinaryOperation<long>(this,result,(long *)&local_60,(long *)&local_80,op);
  return;
}

Assistant:

void ConstantExpression::arithmeticalBinaryOperation( ConstantExpression& result, const ConstantExpression& rhs, AST::ArithmeticExpression::Operator op ) const
        {
            if ( this->getType() == SCALAR_INVALID || rhs.getType() == SCALAR_INVALID )
            {
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, "uninitilized operand(s)" );
                    mErrorHandler->handleError( &error );
                }
                result.setValue( 0. );
                return;
            }

            else if ( (this->getType() == SCALAR_BOOL && rhs.getType() == SCALAR_LONG) || (this->getType() == SCALAR_LONG && rhs.getType() == SCALAR_BOOL) )
            {				
				long val1 = this->getLongValue();
				long val2 = rhs.getLongValue();
				arithmeticalBinaryOperation( result, val1, val2, op );
            }

            else if ( this->getType() == SCALAR_LONG && rhs.getType() == SCALAR_LONG )
            {
                long val1 = this->getLongValue();
                long val2 = rhs.getLongValue();
                arithmeticalBinaryOperation( result, val1, val2, op );
            }

            else
            {
                double val1 = this->getDoubleValue();
                double val2 = rhs.getDoubleValue();
                arithmeticalBinaryOperation( result, val1, val2, op );
            }
        }